

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void google::protobuf::compiler::javanano::anon_unknown_5::SetPrimitiveVariables
               (FieldDescriptor *descriptor,Params *params,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  uint uVar3;
  JavaType JVar4;
  CppType CVar5;
  Type TVar6;
  uint32 uVar7;
  int iVar8;
  WireType type;
  mapped_type *pmVar9;
  ulong uVar10;
  string *psVar11;
  mapped_type *pmVar12;
  char *pcVar13;
  protobuf *this;
  Descriptor *this_00;
  SubstituteArg *in_RCX;
  int i;
  JavaType type_00;
  JavaType type_01;
  JavaType type_02;
  uint i_00;
  uint i_01;
  int i_02;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  unsigned_long i_03;
  SubstituteArg *in_stack_fffffffffffff0d8;
  allocator<char> local_bb1;
  key_type local_bb0;
  string local_b90;
  allocator<char> local_b69;
  key_type local_b68;
  allocator<char> local_b41;
  key_type local_b40;
  string local_b20;
  uint local_b00;
  allocator<char> local_af9;
  int fixed_size;
  string local_ad8;
  allocator<char> local_ab1;
  key_type local_ab0;
  string local_a90;
  allocator<char> local_a69;
  key_type local_a68;
  string local_a48;
  allocator<char> local_a21;
  key_type local_a20;
  allocator<char> local_9f9;
  key_type local_9f8;
  string local_9d8;
  allocator<char> local_9b1;
  key_type local_9b0;
  allocator<char> local_989;
  key_type local_988;
  allocator<char> local_961;
  key_type local_960;
  string local_940;
  allocator<char> local_919;
  key_type local_918;
  allocator<char> local_8f1;
  key_type local_8f0;
  allocator<char> local_8c9;
  key_type local_8c8;
  SubstituteArg local_8a8;
  SubstituteArg local_878;
  SubstituteArg local_848;
  SubstituteArg local_818;
  SubstituteArg local_7e8;
  SubstituteArg local_7b8;
  SubstituteArg local_788;
  SubstituteArg local_758;
  SubstituteArg local_728;
  string local_6f8;
  SubstituteArg local_6d8;
  string local_6a8;
  allocator<char> local_681;
  key_type local_680;
  string local_660;
  allocator<char> local_639;
  key_type local_638;
  string local_618;
  allocator<char> local_5f1;
  key_type local_5f0;
  allocator<char> local_5c9;
  key_type local_5c8;
  allocator<char> local_5a1;
  key_type local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  allocator<char> local_519;
  key_type local_518;
  allocator<char> local_4f1;
  key_type local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  allocator<char> local_4a9;
  key_type local_4a8;
  SubstituteArg local_488;
  SubstituteArg local_458;
  SubstituteArg local_428;
  SubstituteArg local_3f8;
  SubstituteArg local_3c8;
  SubstituteArg local_398;
  SubstituteArg local_368;
  SubstituteArg local_338;
  SubstituteArg local_308;
  string local_2d8;
  SubstituteArg local_2b8;
  string local_288;
  allocator<char> local_261;
  key_type local_260;
  string local_240;
  allocator<char> local_219;
  key_type local_218;
  string local_1f8;
  allocator<char> local_1d1;
  key_type local_1d0;
  string local_1b0;
  allocator<char> local_189;
  key_type local_188;
  string local_168;
  allocator<char> local_141;
  key_type local_140;
  string local_120;
  allocator<char> local_f9;
  key_type local_f8;
  string local_d8;
  string local_b8;
  allocator<char> local_91;
  key_type local_90;
  string local_60;
  string local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  Params *params_local;
  FieldDescriptor *descriptor_local;
  
  local_20 = variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)params;
  params_local = (Params *)descriptor;
  UnderscoresToCamelCase_abi_cxx11_(&local_60,(javanano *)descriptor,(FieldDescriptor *)variables);
  RenameJavaKeywords(&local_40,&local_60);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"name",&local_91);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_90);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_d8,(javanano *)params_local,field);
  RenameJavaKeywords(&local_b8,&local_d8);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"capitalized_name",&local_f9);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_f8);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  uVar3 = FieldDescriptor::number((FieldDescriptor *)params_local);
  SimpleItoa_abi_cxx11_(&local_120,(protobuf *)(ulong)uVar3,i);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"number",&local_141);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_140);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string((string *)&local_120);
  bVar2 = Params::use_reference_types_for_primitives(params);
  if ((!bVar2) || (bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)params_local), bVar2)) {
    JVar4 = GetJavaType((FieldDescriptor *)params_local);
    PrimitiveTypeName_abi_cxx11_(&local_1b0,(javanano *)(ulong)JVar4,type_01);
    pmVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"type",&local_1d1);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_1d0);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  else {
    JVar4 = GetJavaType((FieldDescriptor *)params_local);
    BoxedPrimitiveTypeName_abi_cxx11_(&local_168,(javanano *)(ulong)JVar4,type_00);
    pmVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"type",&local_189);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_188);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    std::__cxx11::string::~string((string *)&local_168);
  }
  CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)params_local);
  if (CVar5 == CPPTYPE_STRING) {
    FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)params_local);
    uVar10 = std::__cxx11::string::empty();
    if (((uVar10 & 1) == 0) && (bVar2 = Params::use_reference_types_for_primitives(params), !bVar2))
    {
      TVar6 = FieldDescriptor::type((FieldDescriptor *)params_local);
      if (TVar6 == TYPE_BYTES) {
        DefaultValue_abi_cxx11_
                  (&local_1f8,(javanano *)params,params_local,(FieldDescriptor *)in_RCX);
        pmVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_218,"default",&local_219);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_218);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::allocator<char>::~allocator(&local_219);
        std::__cxx11::string::~string((string *)&local_1f8);
        FieldDefaultConstantName_abi_cxx11_(&local_240,(javanano *)params_local,field_00);
        pmVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"default_constant",&local_261);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_260);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator(&local_261);
        std::__cxx11::string::~string((string *)&local_240);
        psVar11 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)params_local);
        CEscape(&local_2d8,psVar11);
        strings::internal::SubstituteArg::SubstituteArg(&local_2b8,&local_2d8);
        strings::internal::SubstituteArg::SubstituteArg(&local_308);
        strings::internal::SubstituteArg::SubstituteArg(&local_338);
        strings::internal::SubstituteArg::SubstituteArg(&local_368);
        strings::internal::SubstituteArg::SubstituteArg(&local_398);
        strings::internal::SubstituteArg::SubstituteArg(&local_3c8);
        strings::internal::SubstituteArg::SubstituteArg(&local_3f8);
        strings::internal::SubstituteArg::SubstituteArg(&local_428);
        strings::internal::SubstituteArg::SubstituteArg(&local_458);
        strings::internal::SubstituteArg::SubstituteArg(&local_488);
        in_RCX = &local_308;
        strings::Substitute_abi_cxx11_
                  (&local_288,
                   (strings *)"com.google.protobuf.nano.InternalNano.bytesDefaultValue(\"$0\")",
                   (char *)&local_2b8,in_RCX,&local_338,&local_368,&local_398,&local_3c8,&local_3f8,
                   &local_428,&local_458,&local_488,in_stack_fffffffffffff0d8);
        pmVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a8,"default_constant_value",&local_4a9);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_4a8);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_288);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::allocator<char>::~allocator(&local_4a9);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2d8);
        pmVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f0,"default",&local_4f1);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_4f0);
        std::operator+(&local_4d0,pmVar9,".clone()");
        pmVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_518,"default_copy_if_needed",&local_519);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_518);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_518);
        std::allocator<char>::~allocator(&local_519);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::allocator<char>::~allocator(&local_4f1);
      }
      else {
        psVar11 = FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)params_local);
        bVar2 = AllAscii(psVar11);
        if (bVar2) {
          psVar11 = FieldDescriptor::default_value_string_abi_cxx11_
                              ((FieldDescriptor *)params_local);
          CEscape(&local_580,psVar11);
          std::operator+(&local_560,"\"",&local_580);
          std::operator+(&local_540,&local_560,"\"");
          pmVar1 = local_20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5a0,"default",&local_5a1);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_5a0);
          std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_540);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::allocator<char>::~allocator(&local_5a1);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_560);
          std::__cxx11::string::~string((string *)&local_580);
          pmVar1 = local_20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c8,"default",&local_5c9);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_5c8);
          pmVar1 = local_20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5f0,"default_copy_if_needed",&local_5f1);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](pmVar1,&local_5f0);
          std::__cxx11::string::operator=((string *)pmVar12,(string *)pmVar9);
          std::__cxx11::string::~string((string *)&local_5f0);
          std::allocator<char>::~allocator(&local_5f1);
          std::__cxx11::string::~string((string *)&local_5c8);
          std::allocator<char>::~allocator(&local_5c9);
        }
        else {
          DefaultValue_abi_cxx11_
                    (&local_618,(javanano *)params,params_local,(FieldDescriptor *)in_RCX);
          pmVar1 = local_20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_638,"default",&local_639);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_638);
          std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_618);
          std::__cxx11::string::~string((string *)&local_638);
          std::allocator<char>::~allocator(&local_639);
          std::__cxx11::string::~string((string *)&local_618);
          FieldDefaultConstantName_abi_cxx11_(&local_660,(javanano *)params_local,field_01);
          pmVar1 = local_20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_680,"default_constant",&local_681);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_680);
          std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_660);
          std::__cxx11::string::~string((string *)&local_680);
          std::allocator<char>::~allocator(&local_681);
          std::__cxx11::string::~string((string *)&local_660);
          psVar11 = FieldDescriptor::default_value_string_abi_cxx11_
                              ((FieldDescriptor *)params_local);
          CEscape(&local_6f8,psVar11);
          strings::internal::SubstituteArg::SubstituteArg(&local_6d8,&local_6f8);
          strings::internal::SubstituteArg::SubstituteArg(&local_728);
          strings::internal::SubstituteArg::SubstituteArg(&local_758);
          strings::internal::SubstituteArg::SubstituteArg(&local_788);
          strings::internal::SubstituteArg::SubstituteArg(&local_7b8);
          strings::internal::SubstituteArg::SubstituteArg(&local_7e8);
          strings::internal::SubstituteArg::SubstituteArg(&local_818);
          strings::internal::SubstituteArg::SubstituteArg(&local_848);
          strings::internal::SubstituteArg::SubstituteArg(&local_878);
          strings::internal::SubstituteArg::SubstituteArg(&local_8a8);
          in_RCX = &local_728;
          strings::Substitute_abi_cxx11_
                    (&local_6a8,
                     (strings *)"com.google.protobuf.nano.InternalNano.stringDefaultValue(\"$0\")",
                     (char *)&local_6d8,in_RCX,&local_758,&local_788,&local_7b8,&local_7e8,
                     &local_818,&local_848,&local_878,&local_8a8,in_stack_fffffffffffff0d8);
          pmVar1 = local_20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8c8,"default_constant_value",&local_8c9);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_8c8);
          std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_6a8);
          std::__cxx11::string::~string((string *)&local_8c8);
          std::allocator<char>::~allocator(&local_8c9);
          std::__cxx11::string::~string((string *)&local_6a8);
          std::__cxx11::string::~string((string *)&local_6f8);
          pmVar1 = local_20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8f0,"default",&local_8f1);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_8f0);
          pmVar1 = local_20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_918,"default_copy_if_needed",&local_919);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](pmVar1,&local_918);
          std::__cxx11::string::operator=((string *)pmVar12,(string *)pmVar9);
          std::__cxx11::string::~string((string *)&local_918);
          std::allocator<char>::~allocator(&local_919);
          std::__cxx11::string::~string((string *)&local_8f0);
          std::allocator<char>::~allocator(&local_8f1);
        }
      }
      goto LAB_00486de2;
    }
  }
  DefaultValue_abi_cxx11_(&local_940,(javanano *)params,params_local,(FieldDescriptor *)in_RCX);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"default",&local_961);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_960);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_940);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator(&local_961);
  std::__cxx11::string::~string((string *)&local_940);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_988,"default",&local_989);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_988);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b0,"default_copy_if_needed",&local_9b1);
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](pmVar1,&local_9b0);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)pmVar9);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator(&local_989);
LAB_00486de2:
  JVar4 = GetJavaType((FieldDescriptor *)params_local);
  BoxedPrimitiveTypeName_abi_cxx11_(&local_9d8,(javanano *)(ulong)JVar4,type_02);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f8,"boxed_type",&local_9f9);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_9f8);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_9d8);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::allocator<char>::~allocator(&local_9f9);
  std::__cxx11::string::~string((string *)&local_9d8);
  pcVar13 = GetCapitalizedType((FieldDescriptor *)params_local);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a20,"capitalized_type",&local_a21);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_a20);
  std::__cxx11::string::operator=((string *)pmVar9,pcVar13);
  std::__cxx11::string::~string((string *)&local_a20);
  std::allocator<char>::~allocator(&local_a21);
  uVar7 = internal::WireFormat::MakeTag((FieldDescriptor *)params_local);
  SimpleItoa_abi_cxx11_(&local_a48,(protobuf *)(ulong)uVar7,i_00);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a68,"tag",&local_a69);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_a68);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_a68);
  std::allocator<char>::~allocator(&local_a69);
  std::__cxx11::string::~string((string *)&local_a48);
  iVar8 = FieldDescriptor::number((FieldDescriptor *)params_local);
  TVar6 = FieldDescriptor::type((FieldDescriptor *)params_local);
  this = (protobuf *)internal::WireFormat::TagSize(iVar8,TVar6);
  SimpleItoa_abi_cxx11_(&local_a90,this,i_03);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab0,"tag_size",&local_ab1);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_ab0);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_a90);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::allocator<char>::~allocator(&local_ab1);
  std::__cxx11::string::~string((string *)&local_a90);
  iVar8 = FieldDescriptor::number((FieldDescriptor *)params_local);
  TVar6 = FieldDescriptor::type((FieldDescriptor *)params_local);
  type = internal::WireFormat::WireTypeForFieldType(TVar6);
  uVar7 = internal::WireFormatLite::MakeTag(iVar8,type);
  SimpleItoa_abi_cxx11_(&local_ad8,(protobuf *)(ulong)uVar7,i_01);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fixed_size,"non_packed_tag",&local_af9);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,(key_type *)&fixed_size);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_ad8);
  std::__cxx11::string::~string((string *)&fixed_size);
  std::allocator<char>::~allocator(&local_af9);
  std::__cxx11::string::~string((string *)&local_ad8);
  TVar6 = FieldDescriptor::type((FieldDescriptor *)params_local);
  local_b00 = FixedSize(TVar6);
  if (local_b00 != 0xffffffff) {
    SimpleItoa_abi_cxx11_(&local_b20,(protobuf *)(ulong)local_b00,i_02);
    pmVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b40,"fixed_size",&local_b41)
    ;
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_b40);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b20);
    std::__cxx11::string::~string((string *)&local_b40);
    std::allocator<char>::~allocator(&local_b41);
    std::__cxx11::string::~string((string *)&local_b20);
  }
  this_00 = FieldDescriptor::containing_type((FieldDescriptor *)params_local);
  psVar11 = Descriptor::name_abi_cxx11_(this_00);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b68,"message_name",&local_b69)
  ;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_b68);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)psVar11);
  std::__cxx11::string::~string((string *)&local_b68);
  std::allocator<char>::~allocator(&local_b69);
  EmptyArrayName_abi_cxx11_(&local_b90,(javanano *)params,params_local,(FieldDescriptor *)in_RCX);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb0,"empty_array_name",&local_bb1);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_bb0);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_b90);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::allocator<char>::~allocator(&local_bb1);
  std::__cxx11::string::~string((string *)&local_b90);
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor, const Params params,
                           map<string, string>* variables) {
  (*variables)["name"] =
    RenameJavaKeywords(UnderscoresToCamelCase(descriptor));
  (*variables)["capitalized_name"] =
    RenameJavaKeywords(UnderscoresToCapitalizedCamelCase(descriptor));
  (*variables)["number"] = SimpleItoa(descriptor->number());
  if (params.use_reference_types_for_primitives()
      && !descriptor->is_repeated()) {
    (*variables)["type"] = BoxedPrimitiveTypeName(GetJavaType(descriptor));
  } else {
    (*variables)["type"] = PrimitiveTypeName(GetJavaType(descriptor));
  }
  // Deals with defaults. For C++-string types (string and bytes),
  // we might need to have the generated code do the unicode decoding
  // (see comments in InternalNano.java for gory details.). We would
  // like to do this once into a static field and re-use that from
  // then on.
  if (descriptor->cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
      !descriptor->default_value_string().empty() &&
      !params.use_reference_types_for_primitives()) {
    if (descriptor->type() == FieldDescriptor::TYPE_BYTES) {
      (*variables)["default"] = DefaultValue(params, descriptor);
      (*variables)["default_constant"] = FieldDefaultConstantName(descriptor);
      (*variables)["default_constant_value"] = strings::Substitute(
          "com.google.protobuf.nano.InternalNano.bytesDefaultValue(\"$0\")",
          CEscape(descriptor->default_value_string()));
      (*variables)["default_copy_if_needed"] =
          (*variables)["default"] + ".clone()";
    } else if (AllAscii(descriptor->default_value_string())) {
      // All chars are ASCII.  In this case directly referencing a
      // CEscape()'d string literal works fine.
      (*variables)["default"] =
          "\"" + CEscape(descriptor->default_value_string()) + "\"";
      (*variables)["default_copy_if_needed"] = (*variables)["default"];
    } else {
      // Strings where some chars are non-ASCII. We need to save the
      // default value.
      (*variables)["default"] = DefaultValue(params, descriptor);
      (*variables)["default_constant"] = FieldDefaultConstantName(descriptor);
      (*variables)["default_constant_value"] = strings::Substitute(
          "com.google.protobuf.nano.InternalNano.stringDefaultValue(\"$0\")",
          CEscape(descriptor->default_value_string()));
      (*variables)["default_copy_if_needed"] = (*variables)["default"];
    }
  } else {
    // Non-string, non-bytes field. Defaults are literals.
    (*variables)["default"] = DefaultValue(params, descriptor);
    (*variables)["default_copy_if_needed"] = (*variables)["default"];
  }
  (*variables)["boxed_type"] = BoxedPrimitiveTypeName(GetJavaType(descriptor));
  (*variables)["capitalized_type"] = GetCapitalizedType(descriptor);
  (*variables)["tag"] = SimpleItoa(WireFormat::MakeTag(descriptor));
  (*variables)["tag_size"] = SimpleItoa(
      WireFormat::TagSize(descriptor->number(), descriptor->type()));
  (*variables)["non_packed_tag"] = SimpleItoa(
      internal::WireFormatLite::MakeTag(descriptor->number(),
          internal::WireFormat::WireTypeForFieldType(descriptor->type())));
  int fixed_size = FixedSize(descriptor->type());
  if (fixed_size != -1) {
    (*variables)["fixed_size"] = SimpleItoa(fixed_size);
  }
  (*variables)["message_name"] = descriptor->containing_type()->name();
  (*variables)["empty_array_name"] = EmptyArrayName(params, descriptor);
}